

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

void lj_snap_purge(jit_State *J)

{
  uint uVar1;
  BCReg BVar2;
  ulong uVar3;
  uint maxslot;
  uint8_t udf [255];
  uint8_t auStack_118 [256];
  
  maxslot = J->maxslot;
  if (((char)*J->pc == '\\') && (uVar1 = (uint)J->pt->numparams, uVar1 <= maxslot)) {
    maxslot = uVar1;
  }
  BVar2 = snap_usedef(J,auStack_118,J->pc,maxslot);
  if (BVar2 < maxslot) {
    snap_useuv(J->pt,auStack_118);
    uVar3 = (ulong)BVar2;
    do {
      if (auStack_118[uVar3] != '\0') {
        J->base[uVar3] = 0;
      }
      uVar3 = uVar3 + 1;
    } while (maxslot != uVar3);
  }
  return;
}

Assistant:

void lj_snap_purge(jit_State *J)
{
  uint8_t udf[SNAP_USEDEF_SLOTS];
  BCReg s, maxslot = J->maxslot;
  if (bc_op(*J->pc) == BC_FUNCV && maxslot > J->pt->numparams)
    maxslot = J->pt->numparams;
  s = snap_usedef(J, udf, J->pc, maxslot);
  if (s < maxslot) {
    snap_useuv(J->pt, udf);
    for (; s < maxslot; s++)
      if (udf[s] != 0)
	J->base[s] = 0;  /* Purge dead slots. */
  }
}